

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

BatchResult * __thiscall ProjectOperator::next(ProjectOperator *this)

{
  DbVector *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
  *this_00;
  _Rb_tree_header *p_Var3;
  mapped_type *ppDVar4;
  unique_ptr<BatchResult,_std::default_delete<BatchResult>_> br;
  DbVector *vec;
  _Head_base<0UL,_BatchResult_*,_false> local_28;
  DbVector *local_20;
  
  iVar2 = (*this->next_->_vptr_BaseOperator[4])();
  local_28._M_head_impl = (BatchResult *)CONCAT44(extraout_var,iVar2);
  if (local_28._M_head_impl == (BatchResult *)0x0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)0x0;
  }
  else {
    local_20 = (mapped_type)0x0;
    evaluateExpr_(this,&local_20,this->expr_,local_28._M_head_impl);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
               *)operator_new(0x30);
    pDVar1 = local_20;
    p_Var3 = &(this_00->_M_t)._M_impl.super__Rb_tree_header;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(this_00->_M_t)._M_impl = 0;
    *(undefined8 *)&(this_00->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    (this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppDVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
              ::operator[](this_00,&this->col_name_);
    *ppDVar4 = pDVar1;
  }
  std::unique_ptr<BatchResult,_std::default_delete<BatchResult>_>::~unique_ptr
            ((unique_ptr<BatchResult,_std::default_delete<BatchResult>_> *)&local_28);
  return (BatchResult *)this_00;
}

Assistant:

BatchResult* next() {
        std::unique_ptr<BatchResult> br(next_->next());
        if (br == nullptr)
            return nullptr;

        DbVector* vec = nullptr;
        evaluateExpr_(&vec, expr_, br.get());

        BatchResult* rs = new BatchResult();
        rs->add(col_name_, vec);
        return rs;
    }